

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerModel.cpp
# Opt level: O2

string * __thiscall
tiger::trains::models::PlayerModel::getName_abi_cxx11_
          (string *__return_storage_ptr__,PlayerModel *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

const string PlayerModel::getName() const
{
    return name;
}